

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenSIMDReplaceSetValue(BinaryenExpressionRef expr,BinaryenExpressionRef valueExpr)

{
  if (expr->_id != SIMDReplaceId) {
    __assert_fail("expression->is<SIMDReplace>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xc93,
                  "void BinaryenSIMDReplaceSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (valueExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)valueExpr;
    return;
  }
  __assert_fail("valueExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xc94,
                "void BinaryenSIMDReplaceSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenSIMDReplaceSetValue(BinaryenExpressionRef expr,
                                 BinaryenExpressionRef valueExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDReplace>());
  assert(valueExpr);
  static_cast<SIMDReplace*>(expression)->value = (Expression*)valueExpr;
}